

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::
initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper::RunImpl
          (initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper
           *this)

{
  Message *pMVar1;
  TestResults *pTVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  Message resendReq;
  Message receivedLogon;
  Message sentLogon;
  int local_594;
  undefined **local_590;
  char *local_588;
  char *pcStack_580;
  undefined1 local_578 [16];
  char *pcStack_568;
  undefined1 local_420 [16];
  char *pcStack_410;
  UtcTimeStamp local_2c8 [14];
  Message local_170 [344];
  
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_date = 0x257e44;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = 0x1aa324d61000;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_date = 0x268636;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_time = 0x354649ac2000;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                startTimeStamp.super_DateTime.m_time + 4);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
                super_DateTime.m_time + 4);
  (*(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
    _vptr_Responder[8])(this,1,0,0x1f);
  (this->super_initiatorFixture).super_sessionFixture.object[0x248] = (Session)0x0;
  createLogon((Logon *)local_2c8,"TW","ISLD",1);
  FIX::Message::Message(local_170,(Message *)local_2c8);
  FIX::Message::~Message((Message *)local_2c8);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon((Logon *)local_420,"ISLD","TW",1);
  FIX::Message::Message((Message *)local_2c8,(Message *)local_420);
  FIX::Message::~Message((Message *)local_420);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::DateTime::nowUtc();
  local_578._8_8_ = local_420._8_8_;
  pcStack_568 = pcStack_410;
  local_578._0_8_ = &PTR__DateTime_00324850;
  FIX::Session::next(pMVar1,local_2c8,SUB81(local_578,0));
  FIX::SessionState::setNextSenderMsgSeqNum
            ((SessionState *)((this->super_initiatorFixture).super_sessionFixture.object + 0x250),5)
  ;
  createResendRequest((ResendRequest *)local_578,"ISLD","TW",2,1,10);
  FIX::Message::Message((Message *)local_420,(Message *)local_578);
  FIX::Message::~Message((Message *)local_578);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::DateTime::nowUtc();
  local_588 = (char *)local_578._8_8_;
  pcStack_580 = pcStack_568;
  local_590 = &PTR__DateTime_00324850;
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_420,SUB81(&local_590,0));
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar3;
  local_590._0_4_ = 5;
  local_594 = FIX::SessionState::getNextSenderMsgSeqNum
                        ((SessionState *)
                         ((this->super_initiatorFixture).super_sessionFixture.object + 0x250));
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)local_578,*ppTVar4,0x818);
  UnitTest::CheckEqual<int,int>(pTVar2,(int *)&local_590,&local_594,(TestDetails *)local_578);
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar3;
  local_590 = (undefined **)CONCAT44(local_590._4_4_,2);
  local_594 = FIX::SessionState::getNextTargetMsgSeqNum
                        ((SessionState *)
                         ((this->super_initiatorFixture).super_sessionFixture.object + 0x250));
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)local_578,*ppTVar4,0x819);
  UnitTest::CheckEqual<int,int>(pTVar2,(int *)&local_590,&local_594,(TestDetails *)local_578);
  FIX::Message::~Message((Message *)local_420);
  FIX::Message::~Message((Message *)local_2c8);
  FIX::Message::~Message(local_170);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNums) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  object->setPersistMessages(false);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  object->setNextSenderMsgSeqNum(5);

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 10);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(5, object->getExpectedSenderNum());
  CHECK_EQUAL(2, object->getExpectedTargetNum());

}